

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersenne_twister.h
# Opt level: O0

void __thiscall
dlib::random_helpers::
mersenne_twister<unsigned_int,_32,_624,_397,_31,_2567483615U,_11,_7,_2636928640U,_15,_4022730752U,_18,_3346425566U>
::twist(mersenne_twister<unsigned_int,_32,_624,_397,_31,_2567483615U,_11,_7,_2636928640U,_15,_4022730752U,_18,_3346425566U>
        *this,int block)

{
  uint uVar1;
  uint y_1;
  uint y_3;
  int j_2;
  uint y_2;
  int j_1;
  uint y;
  int j;
  uint lower_mask;
  uint upper_mask;
  int block_local;
  mersenne_twister<unsigned_int,_32,_624,_397,_31,_2567483615U,_11,_7,_2636928640U,_15,_4022730752U,_18,_3346425566U>
  *this_local;
  
  if (block == 0) {
    for (j = 0x270; j < 0x4e0; j = j + 1) {
      uVar1 = 0;
      if ((this->x[j + -0x26f] & 1) != 0) {
        uVar1 = 0x9908b0df;
      }
      this->x[j] = this->x[j + -0xe3] ^
                   (this->x[j + -0x270] & 0x80000000 | this->x[j + -0x26f] & 0x7fffffff) >> 1 ^
                   uVar1;
    }
  }
  else if (block == 1) {
    for (j_1 = 0; j_1 < 0xe3; j_1 = j_1 + 1) {
      uVar1 = 0;
      if ((this->x[j_1 + 0x271] & 1) != 0) {
        uVar1 = 0x9908b0df;
      }
      this->x[j_1] = this->x[j_1 + 0x3fd] ^
                     (this->x[j_1 + 0x270] & 0x80000000 | this->x[j_1 + 0x271] & 0x7fffffff) >> 1 ^
                     uVar1;
    }
    for (j_2 = 0xe3; j_2 < 0x26f; j_2 = j_2 + 1) {
      uVar1 = 0;
      if ((this->x[j_2 + 0x271] & 1) != 0) {
        uVar1 = 0x9908b0df;
      }
      this->x[j_2] = this->x[j_2 + -0xe3] ^
                     (this->x[j_2 + 0x270] & 0x80000000 | this->x[j_2 + 0x271] & 0x7fffffff) >> 1 ^
                     uVar1;
    }
    uVar1 = 0;
    if ((this->x[0] & 1) != 0) {
      uVar1 = 0x9908b0df;
    }
    this->x[0x26f] =
         this->x[0x18c] ^ (this->x[0x4df] & 0x80000000 | this->x[0] & 0x7fffffff) >> 1 ^ uVar1;
    this->i = 0;
  }
  return;
}

Assistant:

void mersenne_twister<UIntType,w,n,m,r,a,u,s,b,t,c,l,val>::twist(
            int block
        )
        {
            const UIntType upper_mask = (~0u) << r;
            const UIntType lower_mask = ~upper_mask;

            if(block == 0) {
                for(int j = n; j < 2*n; j++) {
                    UIntType y = (x[j-n] & upper_mask) | (x[j-(n-1)] & lower_mask);
                    x[j] = x[j-(n-m)] ^ (y >> 1) ^ (y&1 ? a : 0);
                }
            } else if (block == 1) {
                // split loop to avoid costly modulo operations
                {  // extra scope for MSVC brokenness w.r.t. for scope
                    for(int j = 0; j < n-m; j++) {
                        UIntType y = (x[j+n] & upper_mask) | (x[j+n+1] & lower_mask);
                        x[j] = x[j+n+m] ^ (y >> 1) ^ (y&1 ? a : 0);
                    }
                }

                for(int j = n-m; j < n-1; j++) {
                    UIntType y = (x[j+n] & upper_mask) | (x[j+n+1] & lower_mask);
                    x[j] = x[j-(n-m)] ^ (y >> 1) ^ (y&1 ? a : 0);
                }
                // last iteration
                UIntType y = (x[2*n-1] & upper_mask) | (x[0] & lower_mask);
                x[n-1] = x[m-1] ^ (y >> 1) ^ (y&1 ? a : 0);
                i = 0;
            }
        }